

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flattexture.cpp
# Opt level: O0

BYTE * __thiscall FFlatTexture::GetColumn(FFlatTexture *this,uint column,Span **spans_out)

{
  Span **spans_out_local;
  uint column_local;
  FFlatTexture *this_local;
  
  if (this->Pixels == (BYTE *)0x0) {
    MakeTexture(this);
  }
  spans_out_local._4_4_ = column;
  if ((this->super_FTexture).Width <= column) {
    if ((this->super_FTexture).WidthMask + 1 == (uint)(this->super_FTexture).Width) {
      spans_out_local._4_4_ = (this->super_FTexture).WidthMask & column;
    }
    else {
      spans_out_local._4_4_ = column % (uint)(this->super_FTexture).Width;
    }
  }
  if (spans_out != (Span **)0x0) {
    *spans_out = this->DummySpans;
  }
  return this->Pixels + spans_out_local._4_4_ * (this->super_FTexture).Height;
}

Assistant:

const BYTE *FFlatTexture::GetColumn (unsigned int column, const Span **spans_out)
{
	if (Pixels == NULL)
	{
		MakeTexture ();
	}
	if ((unsigned)column >= (unsigned)Width)
	{
		if (WidthMask + 1 == Width)
		{
			column &= WidthMask;
		}
		else
		{
			column %= Width;
		}
	}
	if (spans_out != NULL)
	{
		*spans_out = DummySpans;
	}
	return Pixels + column*Height;
}